

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdentifierExpression.cpp
# Opt level: O0

void __thiscall hdc::IdentifierExpression::IdentifierExpression(IdentifierExpression *this)

{
  IdentifierExpression *this_local;
  
  Expression::Expression(&this->super_Expression);
  (this->super_Expression).super_Statement.super_ASTNode._vptr_ASTNode =
       (_func_int **)&PTR_accept_00220e08;
  Token::Token(&this->name);
  Token::Token(&this->alias);
  this->alias_flag = false;
  ASTNode::setKind((ASTNode *)this,AST_IDENTIFIER);
  this->symbol = (Symbol *)0x0;
  this->idxOverloaded = -1;
  return;
}

Assistant:

IdentifierExpression::IdentifierExpression() {
    this->alias_flag = false;
    this->setKind(AST_IDENTIFIER);
    this->symbol = nullptr;
    this->idxOverloaded = -1;
}